

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,long input)

{
  hugeint_t *phVar1;
  idx_t iVar2;
  long in_RDI;
  hugeint_t hVar3;
  long unaff_retaddr;
  uint64_t local_28;
  int64_t local_20;
  
  hVar3 = Cast::Operation<long,duckdb::hugeint_t>(unaff_retaddr);
  phVar1 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x93e7ea);
  iVar2 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  local_28 = hVar3.lower;
  phVar1[iVar2].lower = local_28;
  local_20 = hVar3.upper;
  phVar1[iVar2].upper = local_20;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}